

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall
bloom_tests::bloom_create_insert_serialize::test_method(bloom_create_insert_serialize *this)

{
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  Span<const_unsigned_char> vKey_02;
  Span<const_unsigned_char> vKey_03;
  Span<const_unsigned_char> vKey_04;
  Span<const_unsigned_char> vKey_05;
  Span<const_unsigned_char> vKey_06;
  Span<const_unsigned_char> vKey_07;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  left_begin;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  left_end;
  lazy_ostream *right_begin;
  long in_FS_OFFSET;
  DataStream stream;
  CBloomFilter filter;
  array<std::byte,_13UL> expected;
  CBloomFilter *in_stack_fffffffffffffa18;
  char *in_stack_fffffffffffffa20;
  char *in_stack_fffffffffffffa28;
  CBloomFilter *in_stack_fffffffffffffa30;
  CBloomFilter *this_00;
  const_string *in_stack_fffffffffffffa40;
  undefined7 in_stack_fffffffffffffa48;
  undefined1 in_stack_fffffffffffffa4f;
  lazy_ostream *in_stack_fffffffffffffa50;
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  undefined8 in_stack_fffffffffffffa60;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6f;
  undefined8 in_stack_fffffffffffffa70;
  CBloomFilter *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffb18;
  const_string local_490;
  lazy_ostream local_480 [3];
  const_string local_418;
  lazy_ostream local_408 [2];
  assertion_result local_3e0 [2];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  const_string local_380;
  lazy_ostream local_370 [3];
  assertion_result local_340 [3];
  const_string local_2f8;
  lazy_ostream local_2e8 [3];
  assertion_result local_2b8 [3];
  const_string local_270;
  lazy_ostream local_260 [3];
  assertion_result local_230 [2];
  const_string local_1f8;
  lazy_ostream local_1e8 [3];
  assertion_result local_1b8 [3];
  const_string local_170;
  lazy_ostream local_160 [3];
  assertion_result local_130 [5];
  undefined8 local_b5;
  undefined4 local_ad;
  undefined1 local_a9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CBloomFilter::CBloomFilter
            (in_stack_fffffffffffffa78,(uint)((ulong)in_stack_fffffffffffffa70 >> 0x20),
             (double)CONCAT17(in_stack_fffffffffffffa6f,in_stack_fffffffffffffa68),
             (uint)((ulong)in_stack_fffffffffffffa60 >> 0x20),
             (uchar)((ulong)in_stack_fffffffffffffa60 >> 0x18));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
               (const_string *)in_stack_fffffffffffffa50,
               CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
               in_stack_fffffffffffffa40);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___153,_16,_138,_216,_237,_155,_182,_39,_77,_57,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    vKey_02.m_size._0_7_ = in_stack_fffffffffffffa58;
    vKey_02.m_data = (uchar *)in_stack_fffffffffffffa50;
    vKey_02.m_size._7_1_ = in_stack_fffffffffffffa5f;
    CBloomFilter::contains(in_stack_fffffffffffffa30,vKey_02);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28,
               SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa20,(char (*) [30])in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa18 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_130,local_160,&local_170,0x27,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>
                        *)in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___153,_16,_138,_216,_237,_155,_182,_39,_77,_57,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
             (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  vKey.m_size._0_7_ = in_stack_fffffffffffffa48;
  vKey.m_data = (uchar *)in_stack_fffffffffffffa40;
  vKey.m_size._7_1_ = in_stack_fffffffffffffa4f;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffffa28,vKey);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
               (const_string *)in_stack_fffffffffffffa50,
               CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
               in_stack_fffffffffffffa40);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___153,_16,_138,_216,_237,_155,_182,_39,_77,_57,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    vKey_03.m_size._0_7_ = in_stack_fffffffffffffa58;
    vKey_03.m_data = (uchar *)in_stack_fffffffffffffa50;
    vKey_03.m_size._7_1_ = in_stack_fffffffffffffa5f;
    uVar2 = CBloomFilter::contains(in_stack_fffffffffffffa30,vKey_03);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28,
               SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
    left_end._M_current = (byte *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa20,(char (*) [51])in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa18 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_1b8,local_1e8,&local_1f8,0x29,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>
                        *)in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
               (const_string *)in_stack_fffffffffffffa50,
               CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
               in_stack_fffffffffffffa40);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___25,_16,_138,_216,_237,_155,_182,_39,_77,_57,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    vKey_04.m_size._0_7_ = in_stack_fffffffffffffa58;
    vKey_04.m_data = (uchar *)in_stack_fffffffffffffa50;
    vKey_04.m_size._7_1_ = in_stack_fffffffffffffa5f;
    CBloomFilter::contains(in_stack_fffffffffffffa30,vKey_04);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28,
               SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa20,(char (*) [46])in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa18 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_230,local_260,&local_270,0x2b,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]>
                        *)in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___181,_162,_199,_134,_217,_239,_70,_88,_40,_124,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
             (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  vKey_00.m_size._0_7_ = in_stack_fffffffffffffa48;
  vKey_00.m_data = (uchar *)in_stack_fffffffffffffa40;
  vKey_00.m_size._7_1_ = in_stack_fffffffffffffa4f;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffffa28,vKey_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
               (const_string *)in_stack_fffffffffffffa50,
               CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
               in_stack_fffffffffffffa40);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___181,_162,_199,_134,_217,_239,_70,_88,_40,_124,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    vKey_05.m_size._0_7_ = in_stack_fffffffffffffa58;
    vKey_05.m_data = (uchar *)in_stack_fffffffffffffa50;
    vKey_05.m_size._7_1_ = in_stack_fffffffffffffa5f;
    uVar3 = CBloomFilter::contains(in_stack_fffffffffffffa30,vKey_05);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28,
               SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
    right_begin = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa20,(char (*) [55])in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa18 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_2b8,local_2e8,&local_2f8,0x2e,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[55],_const_char_(&)[55]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[55],_const_char_(&)[55]>
                        *)in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    uVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar4);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___185,_48,_6,_112,_180,_197,_54,_110,_149,_178,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
             (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  vKey_01.m_size._0_7_ = in_stack_fffffffffffffa48;
  vKey_01.m_data = (uchar *)in_stack_fffffffffffffa40;
  vKey_01.m_size._7_1_ = in_stack_fffffffffffffa4f;
  CBloomFilter::insert((CBloomFilter *)in_stack_fffffffffffffa28,vKey_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
               (const_string *)in_stack_fffffffffffffa50,
               CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
               in_stack_fffffffffffffa40);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___185,_48,_6,_112,_180,_197,_54,_110,_149,_178,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    vKey_06.m_size._0_7_ = in_stack_fffffffffffffa58;
    vKey_06.m_data = (uchar *)in_stack_fffffffffffffa50;
    vKey_06.m_size._7_1_ = in_stack_fffffffffffffa5f;
    CBloomFilter::contains(in_stack_fffffffffffffa30,vKey_06);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28,
               SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa20,(char (*) [55])in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa18 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_340,local_370,&local_380,0x31,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[55],_const_char_(&)[55]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[55],_const_char_(&)[55]>
                        *)in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_398 = 0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffa18);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffa28,(CBloomFilter *)in_stack_fffffffffffffa20);
  local_b5 = 0x59b4e6103;
  local_ad = 0;
  local_a9 = 1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
               (const_string *)in_stack_fffffffffffffa50,
               CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
               in_stack_fffffffffffffa40);
    DataStream::begin((DataStream *)in_stack_fffffffffffffa28);
    DataStream::end((DataStream *)in_stack_fffffffffffffa20);
    std::array<std::byte,_13UL>::begin((array<std::byte,_13UL> *)in_stack_fffffffffffffa18);
    std::array<std::byte,_13UL>::end((array<std::byte,_13UL> *)in_stack_fffffffffffffa18);
    left_begin._M_current._7_1_ = uVar2;
    left_begin._M_current._0_7_ = in_stack_fffffffffffffb18;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((equal_coll_impl *)CONCAT17(uVar3,in_stack_fffffffffffffad8),left_begin,left_end,
               (byte *)right_begin,(byte *)CONCAT17(uVar4,in_stack_fffffffffffffac8));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa20,(char (*) [1])in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    this_00 = (CBloomFilter *)0x1bb4f19;
    in_stack_fffffffffffffa28 = "stream.end()";
    in_stack_fffffffffffffa20 = "stream.begin()";
    in_stack_fffffffffffffa18 = (CBloomFilter *)&DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_3e0,local_408,&local_418,0x37,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
               (const_string *)in_stack_fffffffffffffa50,
               CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
               in_stack_fffffffffffffa40);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___153,_16,_138,_216,_237,_155,_182,_39,_77,_57,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffa28,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    vKey_07.m_size._0_7_ = in_stack_fffffffffffffa58;
    vKey_07.m_data = (uchar *)in_stack_fffffffffffffa50;
    vKey_07.m_size._7_1_ = in_stack_fffffffffffffa5f;
    in_stack_fffffffffffffa5f = CBloomFilter::contains(this_00,vKey_07);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffa28,
               SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
    in_stack_fffffffffffffa50 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffa20,(char (*) [51])in_stack_fffffffffffffa18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
               (unsigned_long)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa18 = (CBloomFilter *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffbb0,local_480,&local_490,0x39,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>
                        *)in_stack_fffffffffffffa18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa18);
    in_stack_fffffffffffffa4f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffa4f);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffa18);
  CBloomFilter::~CBloomFilter(in_stack_fffffffffffffa18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_create_insert_serialize)
{
    CBloomFilter filter(3, 0.01, 0, BLOOM_UPDATE_ALL);

    BOOST_CHECK_MESSAGE( !filter.contains("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter should be empty!");
    filter.insert("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8);
    BOOST_CHECK_MESSAGE( filter.contains("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter doesn't contain just-inserted object!");
    // One bit different in first byte
    BOOST_CHECK_MESSAGE(!filter.contains("19108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter contains something it shouldn't!");

    filter.insert("b5a2c786d9ef4658287ced5914b37a1b4aa32eee"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.contains("b5a2c786d9ef4658287ced5914b37a1b4aa32eee"_hex_u8), "Bloom filter doesn't contain just-inserted object (2)!");

    filter.insert("b9300670b4c5366e95b2699e8b18bc75e5f729c5"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.contains("b9300670b4c5366e95b2699e8b18bc75e5f729c5"_hex_u8), "Bloom filter doesn't contain just-inserted object (3)!");

    DataStream stream{};
    stream << filter;

    constexpr auto expected{"03614e9b050000000000000001"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(stream.begin(), stream.end(), expected.begin(), expected.end());

    BOOST_CHECK_MESSAGE( filter.contains("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter doesn't contain just-inserted object!");
}